

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O0

bsc_step_t bsc_sync(bsc_step_t until)

{
  int iVar1;
  uint pid;
  bsp_pid_t bVar2;
  bsc_step_t *pbVar3;
  request_t *prVar4;
  bsc_size_t size;
  void *xs;
  void *a0;
  void *a;
  bsc_reduce_t f;
  request_t *r_2;
  uint j;
  request_t *r_1;
  request_t *r;
  bsc_step_t common_step;
  uint sz;
  uint P;
  uint i;
  state_t *sbsc;
  bsc_step_t until_local;
  
  sbsc._4_4_ = until;
  _P = bsc();
  common_step = bsp_nprocs();
  r._4_4_ = 4;
  if (_P->next_step == (bsc_step_t *)0x0) {
    bVar2 = bsp_nprocs();
    pbVar3 = (bsc_step_t *)calloc((long)bVar2,4);
    _P->next_step = pbVar3;
    pbVar3 = _P->next_step;
    bVar2 = bsp_nprocs();
    bsp_push_reg(pbVar3,bVar2 << 2);
    bsp_sync();
  }
  do {
    if (sbsc._4_4_ <= _P->current && sbsc._4_4_ != 0xffffffff) {
LAB_001332e3:
      return _P->current;
    }
    r._0_4_ = sbsc._4_4_;
    for (sz = 0; sz < common_step; sz = sz + 1) {
      _P->next_step[sz] = 0xffffffff;
    }
    if (_P->horizon != 0) {
      for (sz = 0; sz < _P->n_requests[_P->queue_start]; sz = sz + 1) {
        if (_P->queue[(ulong)(_P->queue_start * _P->max_requests_per_step) + (ulong)sz].kind == COLL
           ) {
          expand_coll(&_P->queue[(ulong)(_P->queue_start * _P->max_requests_per_step) + (ulong)sz].
                       payload.coll);
        }
      }
      schedule_colls();
      for (sz = 0; sz < _P->n_requests[_P->queue_start]; sz = sz + 1) {
        prVar4 = _P->queue + (ulong)(_P->queue_start * _P->max_requests_per_step) + (ulong)sz;
        if (prVar4->kind == PUT) {
          iVar1 = (prVar4->payload).put.src_pid;
          bVar2 = bsp_pid();
          if (iVar1 != bVar2) {
            __assert_fail("r->payload.put.src_pid == bsp_pid()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/bsc.c"
                          ,0x22e,"bsc_step_t bsc_sync(bsc_step_t)");
          }
          bsp_put((prVar4->payload).put.dst_pid,(prVar4->payload).put.src_addr,
                  (prVar4->payload).put.dst_addr,(prVar4->payload).put.offset,
                  (prVar4->payload).put.size);
        }
        else if (prVar4->kind == GET) {
          iVar1 = (prVar4->payload).put.dst_pid;
          bVar2 = bsp_pid();
          if (iVar1 != bVar2) {
            __assert_fail("r->payload.get.dst_pid == bsp_pid()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/bsc.c"
                          ,0x233,"bsc_step_t bsc_sync(bsc_step_t)");
          }
          bsp_get((prVar4->payload).put.src_pid,(prVar4->payload).put.src_addr,
                  (prVar4->payload).put.offset,(prVar4->payload).put.dst_addr,
                  (prVar4->payload).put.size);
        }
      }
      _P->total_n_outstanding_requests =
           _P->total_n_outstanding_requests - _P->n_requests[_P->queue_start];
      if (_P->total_n_outstanding_requests == 0) {
        r._0_4_ = sbsc._4_4_;
      }
      else {
        r._0_4_ = 1;
        while (((bsc_step_t)r < _P->horizon &&
               (_P->n_requests[(_P->queue_start + (bsc_step_t)r) % _P->horizon] == 0))) {
          r._0_4_ = (bsc_step_t)r + 1;
        }
        r._0_4_ = _P->current + (bsc_step_t)r;
      }
    }
    if ((bsc_step_t)r != 0xffffffff) {
      for (sz = 0; pid = sz, sz < common_step; sz = sz + 1) {
        pbVar3 = _P->next_step;
        bVar2 = bsp_pid();
        bsp_put(pid,&r,pbVar3,bVar2 * r._4_4_,r._4_4_);
      }
    }
    bsp_sync();
    r._0_4_ = sbsc._4_4_;
    for (sz = 0; sz < common_step; sz = sz + 1) {
      if (_P->next_step[sz] < (bsc_step_t)r) {
        r._0_4_ = _P->next_step[sz];
      }
    }
    if (_P->horizon != 0) {
      for (sz = 0; sz < _P->n_requests[_P->queue_start]; sz = sz + 1) {
        prVar4 = _P->queue + (ulong)(_P->queue_start * _P->max_requests_per_step) + (ulong)sz;
        if (prVar4->kind == EXEC) {
          (*(prVar4->payload).exec.func)
                    ((prVar4->payload).put.dst_addr,(prVar4->payload).exec.a0,
                     (prVar4->payload).exec.xs,(prVar4->payload).exec.size);
        }
      }
      _P->n_requests[_P->queue_start] = 0;
      _P->queue_start = ((_P->queue_start + (bsc_step_t)r) - _P->current) % _P->horizon;
    }
    if ((bsc_step_t)r == 0xffffffff) {
      if (_P->total_n_outstanding_requests != 0) {
        __assert_fail("sbsc->total_n_outstanding_requests == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/bsc.c"
                      ,0x267,"bsc_step_t bsc_sync(bsc_step_t)");
      }
      _P->current = 0;
      _P->queue_start = 0;
      goto LAB_001332e3;
    }
    _P->current = (bsc_step_t)r;
  } while( true );
}

Assistant:

bsc_step_t bsc_sync( bsc_step_t until )
{
    state_t * const sbsc = bsc();
    unsigned i, P = bsp_nprocs(), sz=sizeof(sbsc->next_step[0]);
    if ( !sbsc->next_step) {
        /* do some initialization */
        sbsc->next_step = calloc( bsp_nprocs(), sizeof(sbsc->next_step[0]));
        bsp_push_reg( sbsc->next_step, 
                bsp_nprocs() * sizeof(sbsc->next_step[0]) );
        bsp_sync();
    }

    while ( sbsc->current < until || until == bsc_flush ) {
        bsc_step_t common_step = until;
        for ( i = 0; i < P; ++i ) 
            sbsc->next_step[i] = bsc_flush;

        if (sbsc->horizon > 0) {
            /* expand all collectives */
            for ( i = 0; i < sbsc->n_requests[sbsc->queue_start]; ++i ) {
                 request_t * r = sbsc->queue + 
                    sbsc->queue_start * sbsc->max_requests_per_step + i ;
                 if ( r->kind == COLL ) {
                     expand_coll( & r->payload.coll );
                 }
            }
            /* and insert them in small pieces into the queue */
            schedule_colls();

            /* execute the delayed puts and gets */
            for ( i = 0; i < sbsc->n_requests[sbsc->queue_start]; ++i ) {
                 request_t * r = sbsc->queue + 
                    sbsc->queue_start * sbsc->max_requests_per_step + i ;
                 if ( r->kind == PUT ) {
                    assert( r->payload.put.src_pid == bsp_pid() ) ;
                    bsp_put( r->payload.put.dst_pid, 
                            r->payload.put.src_addr, r->payload.put.dst_addr, 
                            r->payload.put.offset, r->payload.put.size );
                 } else if ( r->kind == GET ) {
                    assert( r->payload.get.dst_pid == bsp_pid() ) ;
                    bsp_get( r->payload.get.src_pid, r->payload.get.src_addr,
                            r->payload.get.offset, r->payload.get.dst_addr, 
                            r->payload.get.size );
                 }
            }
            sbsc->total_n_outstanding_requests 
                -= sbsc->n_requests[ sbsc->queue_start ];

            /* search for the step this process can skip to */
            if ( 0 == sbsc->total_n_outstanding_requests ) {
                common_step = until;
            } else {
                for (common_step = 1; common_step < sbsc->horizon ; common_step++){
                    unsigned j = (sbsc->queue_start + common_step) % sbsc->horizon;
                    if ( sbsc->n_requests[j]  != 0 ) {
                        break;
                    }
                } 
                common_step += sbsc->current;
            }
        }

        if ( common_step != bsc_flush ) {
            for ( i = 0; i < P; ++i ) 
                bsp_put( i, &common_step, sbsc->next_step, bsp_pid()*sz, sz );
        }
        bsp_sync();
        common_step = until;
        for ( i = 0; i < P; ++i ) {
            if ( sbsc->next_step[i] < common_step )
                common_step = sbsc->next_step[i];
        }

        if (sbsc->horizon > 0) {
            /* execute the delayed local reduce operations */
            for ( i = 0; i < sbsc->n_requests[sbsc->queue_start]; ++i ) {
                request_t * r = sbsc->queue + 
                    sbsc->queue_start * sbsc->max_requests_per_step + i ;
                if ( r->kind == EXEC ) {
                    bsc_reduce_t f = r->payload.exec.func;
                    void * a = r->payload.exec.a;
                    const void * a0 = r->payload.exec.a0 ;
                    const void * xs = r->payload.exec.xs;
                    bsc_size_t size = r->payload.exec.size;
                    (*f)( a, a0, xs, size );
                }
            }
            sbsc->n_requests[ sbsc->queue_start ] = 0;
            sbsc->queue_start = (sbsc->queue_start+common_step-sbsc->current) % sbsc->horizon;
        }
        if ( common_step == bsc_flush ) {
            assert( sbsc->total_n_outstanding_requests == 0 );
            sbsc->current = 0;
            sbsc->queue_start = 0;
            break;
        }
        sbsc->current = common_step ;
    }

    return sbsc->current;
}